

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::RowSingletonPS
          (RowSingletonPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _i,int _j,bool strictLo,bool strictUp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *newLo,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newUp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldLo,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSense SVar4;
  element_type *peVar5;
  pointer pnVar6;
  Item *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  peVar5 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a2340;
  (this->super_PostStep).m_name = "RowSingleton";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_70);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__RowSingletonPS_006a2550;
  this->m_i = _i;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_j = _j;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar6[_i].m_backend.data + 0x20);
  uVar8 = *(undefined8 *)&pnVar6[_i].m_backend.data;
  uVar9 = *(undefined8 *)((long)&pnVar6[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[_i].m_backend.data + 0x10);
  uVar10 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_lhs).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2) = uVar9;
  (this->m_lhs).m_backend.exp = pnVar6[_i].m_backend.exp;
  (this->m_lhs).m_backend.neg = pnVar6[_i].m_backend.neg;
  iVar11 = pnVar6[_i].m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar11;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar6[_i].m_backend.data + 0x20);
  uVar8 = *(undefined8 *)&pnVar6[_i].m_backend.data;
  uVar9 = *(undefined8 *)((long)&pnVar6[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[_i].m_backend.data + 0x10);
  uVar10 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar9;
  (this->m_rhs).m_backend.exp = pnVar6[_i].m_backend.exp;
  (this->m_rhs).m_backend.neg = pnVar6[_i].m_backend.neg;
  iVar11 = pnVar6[_i].m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar11;
  this->m_strictLo = strictLo;
  this->m_strictUp = strictUp;
  SVar4 = lp->thesense;
  this->m_maxSense = SVar4 == MAXIMIZE;
  if (SVar4 == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_obj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_68,lp,_j);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8) =
         local_68.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) =
         local_68.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6) =
         local_68.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this->m_obj).m_backend.data._M_elems = local_68.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) =
         local_68.m_backend.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_68.m_backend.exp;
    (this->m_obj).m_backend.neg = local_68.m_backend.neg;
    (this->m_obj).m_backend.fpclass = local_68.m_backend.fpclass;
    (this->m_obj).m_backend.prec_elem = local_68.m_backend.prec_elem;
    if (local_68.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_obj).m_backend.data._M_elems[0] != 0) {
      (this->m_obj).m_backend.neg = (bool)(local_68.m_backend.neg ^ 1);
    }
  }
  pIVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_j].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar7[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar7 + iVar2));
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((newLo->m_backend).data._M_elems + 8);
  uVar8 = *(undefined8 *)(newLo->m_backend).data._M_elems;
  uVar9 = *(undefined8 *)((newLo->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((newLo->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 4) =
       *(undefined8 *)((newLo->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_newLo).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 2) = uVar9;
  (this->m_newLo).m_backend.exp = (newLo->m_backend).exp;
  (this->m_newLo).m_backend.neg = (newLo->m_backend).neg;
  iVar11 = (newLo->m_backend).prec_elem;
  (this->m_newLo).m_backend.fpclass = (newLo->m_backend).fpclass;
  (this->m_newLo).m_backend.prec_elem = iVar11;
  uVar8 = *(undefined8 *)((newUp->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((newUp->m_backend).data._M_elems + 4);
  uVar10 = *(undefined8 *)((newUp->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_newUp).m_backend.data._M_elems =
       *(undefined8 *)(newUp->m_backend).data._M_elems;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 2) = uVar8;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 4) = uVar9;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((newUp->m_backend).data._M_elems + 8);
  (this->m_newUp).m_backend.exp = (newUp->m_backend).exp;
  (this->m_newUp).m_backend.neg = (newUp->m_backend).neg;
  iVar11 = (newUp->m_backend).prec_elem;
  (this->m_newUp).m_backend.fpclass = (newUp->m_backend).fpclass;
  (this->m_newUp).m_backend.prec_elem = iVar11;
  uVar8 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 4);
  uVar10 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_oldLo).m_backend.data._M_elems =
       *(undefined8 *)(oldLo->m_backend).data._M_elems;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2) = uVar8;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4) = uVar9;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldLo->m_backend).data._M_elems + 8);
  (this->m_oldLo).m_backend.exp = (oldLo->m_backend).exp;
  (this->m_oldLo).m_backend.neg = (oldLo->m_backend).neg;
  iVar11 = (oldLo->m_backend).prec_elem;
  (this->m_oldLo).m_backend.fpclass = (oldLo->m_backend).fpclass;
  (this->m_oldLo).m_backend.prec_elem = iVar11;
  uVar8 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 4);
  uVar10 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems =
       *(undefined8 *)(oldUp->m_backend).data._M_elems;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2) = uVar8;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4) = uVar9;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldUp->m_backend).data._M_elems + 8);
  (this->m_oldUp).m_backend.exp = (oldUp->m_backend).exp;
  (this->m_oldUp).m_backend.neg = (oldUp->m_backend).neg;
  iVar11 = (oldUp->m_backend).prec_elem;
  (this->m_oldUp).m_backend.fpclass = (oldUp->m_backend).fpclass;
  (this->m_oldUp).m_backend.prec_elem = iVar11;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rowObj(&this->m_row_obj,lp,_i);
  return;
}

Assistant:

RowSingletonPS(const SPxLPBase<R>& lp, int _i, int _j, bool strictLo, bool strictUp,
                     R newLo, R newUp, R oldLo, R oldUp, std::shared_ptr<Tolerances> tols)
         : PostStep("RowSingleton", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_j(_j)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_strictLo(strictLo)
         , m_strictUp(strictUp)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_col(lp.colVector(_j))
         , m_newLo(newLo)
         , m_newUp(newUp)
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_row_obj(lp.rowObj(_i))
      {}